

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

ElemSegment * __thiscall wabt::Module::GetElemSegment(Module *this,Var *var)

{
  pointer ppEVar1;
  Index IVar2;
  ElemSegment *pEVar3;
  
  IVar2 = BindingHash::FindIndex(&this->elem_segment_bindings,var);
  ppEVar1 = (this->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)IVar2 <
      (ulong)((long)(this->elem_segments).
                    super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3)) {
    pEVar3 = ppEVar1[IVar2];
  }
  else {
    pEVar3 = (ElemSegment *)0x0;
  }
  return pEVar3;
}

Assistant:

const ElemSegment* Module::GetElemSegment(const Var& var) const {
  return const_cast<Module*>(this)->GetElemSegment(var);
}